

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O2

void __thiscall Utils::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  pointer ppVVar1;
  pointer ppAVar2;
  _Rb_tree_node_base *p_Var3;
  pointer ppVVar4;
  pointer ppAVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
  i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
  local_58;
  
  ppVVar1 = (this->positionals).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar4 = (this->positionals).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar4 != ppVVar1; ppVVar4 = ppVVar4 + 1
      ) {
    if (*ppVVar4 != (ValueArgObj *)0x0) {
      (*((*ppVVar4)->super_ArgObject)._vptr_ArgObject[1])();
    }
  }
  ppVVar1 = (this->options).
            super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppVVar4 = (this->options).
                 super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVVar4 != ppVVar1; ppVVar4 = ppVVar4 + 1
      ) {
    if (*ppVVar4 != (ValueArgObj *)0x0) {
      (*((*ppVVar4)->super_ArgObject)._vptr_ArgObject[1])();
    }
  }
  ppAVar2 = (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar5 = (this->flags).
                 super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppAVar5 != ppAVar2; ppAVar5 = ppAVar5 + 1) {
    if (*ppAVar5 != (ArgFlag *)0x0) {
      (*((*ppAVar5)->super_ArgObject)._vptr_ArgObject[1])();
    }
  }
  for (p_Var3 = (this->option_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->option_mapping)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
            *)&local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>
            *)(p_Var3 + 1));
    local_58.second = (ArgObject *)0x0;
    std::__cxx11::string::~string((string *)&local_58);
  }
  for (p_Var3 = (this->flag_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->flag_mapping)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
    ::pair(&local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>
            *)(p_Var3 + 1));
    local_58.second = (ArgObject *)0x0;
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&this->long_text);
  std::__cxx11::string::~string((string *)&this->short_text);
  std::__cxx11::string::~string((string *)&this->program_name);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgObject_*>_>_>
  ::~_Rb_tree(&(this->flag_mapping)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ValueArgObj_*>_>_>
  ::~_Rb_tree(&(this->option_mapping)._M_t);
  std::_Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::~_Vector_base
            (&(this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>)
  ;
  std::_Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::~_Vector_base
            (&(this->options).
              super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>);
  std::_Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::~_Vector_base
            (&(this->positionals).
              super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->used_identifier)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  return;
}

Assistant:

inline ArgumentParser::~ArgumentParser() {
    for ( auto i : positionals ) delete i;
    for ( auto i : options  )    delete i;
    for ( auto i : flags )       delete i;

    for ( auto i : option_mapping ) i.second = nullptr;
    for ( auto i : flag_mapping )   i.second = nullptr;
}